

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O0

UNewDataMemory *
udata_create(char *dir,char *type,char *name,UDataInfo *pInfo,char *comment,UErrorCode *pErrorCode)

{
  UBool UVar1;
  ushort uVar2;
  size_t sVar3;
  FileStream *pFVar4;
  char *p;
  undefined1 local_268 [4];
  int32_t length;
  uint8_t bytes [16];
  char filename [512];
  ushort local_4c;
  ushort local_4a;
  uint16_t commentLength;
  uint16_t headerSize;
  UNewDataMemory *pData;
  UErrorCode *pErrorCode_local;
  char *comment_local;
  UDataInfo *pInfo_local;
  char *name_local;
  char *type_local;
  char *dir_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    dir_local = (char *)0x0;
  }
  else if ((name == (char *)0x0) || ((*name == '\0' || (pInfo == (UDataInfo *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    dir_local = (char *)0x0;
  }
  else {
    dir_local = (char *)uprv_malloc_63(0x10);
    if ((long *)dir_local == (long *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      dir_local = (char *)0x0;
    }
    else {
      p._4_4_ = 0;
      if ((dir != (char *)0x0) && (*dir != '\0')) {
        sVar3 = strlen(dir);
        p._4_4_ = (int)sVar3;
        sVar3 = strlen(dir);
        if (dir[sVar3 - 1] != '/') {
          p._4_4_ = p._4_4_ + 1;
        }
      }
      sVar3 = strlen(name);
      p._4_4_ = (int)sVar3 + p._4_4_;
      if ((type != (char *)0x0) && (*type != '\0')) {
        sVar3 = strlen(type);
        p._4_4_ = (int)sVar3 + p._4_4_;
      }
      if (p._4_4_ < 0x200) {
        if ((dir == (char *)0x0) || (*dir == '\0')) {
          bytes[8] = '\0';
        }
        else {
          sVar3 = strlen(dir);
          strcpy((char *)(bytes + 8),dir);
          if (bytes[sVar3 + 7] != '/') {
            bytes[sVar3 + 8] = '/';
            bytes[sVar3 + 9] = '\0';
          }
        }
        strcat((char *)(bytes + 8),name);
        if ((type != (char *)0x0) && (*type != '\0')) {
          strcat((char *)(bytes + 8),".");
          strcat((char *)(bytes + 8),type);
        }
        pFVar4 = T_FileStream_open((char *)(bytes + 8),"wb");
        *(FileStream **)dir_local = pFVar4;
        if (*(long *)dir_local == 0) {
          uprv_free_63(dir_local);
          *pErrorCode = U_FILE_ACCESS_ERROR;
          dir_local = (char *)0x0;
        }
        else {
          local_4a = pInfo->size + 4;
          if ((comment == (char *)0x0) || (*comment == '\0')) {
            local_4c = 0;
          }
          else {
            sVar3 = strlen(comment);
            local_4c = (short)sVar3 + 1;
            local_4a = local_4a + local_4c;
          }
          *(ushort *)((long)dir_local + 8) = local_4a + 0xf & 0xfff0;
          *(undefined1 *)((long)dir_local + 10) = 0xda;
          *(undefined1 *)((long)dir_local + 0xb) = 0x27;
          T_FileStream_write(*(FileStream **)dir_local,(long *)((long)dir_local + 8),4);
          T_FileStream_write(*(FileStream **)dir_local,pInfo,(uint)pInfo->size);
          if (local_4c != 0) {
            T_FileStream_write(*(FileStream **)dir_local,comment,(uint)local_4c);
          }
          if ((local_4a & 0xf) != 0) {
            uVar2 = 0x10 - (local_4a & 0xf);
            memset(local_268,0,(ulong)uVar2);
            T_FileStream_write(*(FileStream **)dir_local,local_268,(uint)uVar2);
          }
        }
      }
      else {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        uprv_free_63(dir_local);
        dir_local = (char *)0x0;
      }
    }
  }
  return (UNewDataMemory *)dir_local;
}

Assistant:

U_CAPI UNewDataMemory * U_EXPORT2
udata_create(const char *dir, const char *type, const char *name,
             const UDataInfo *pInfo,
             const char *comment,
             UErrorCode *pErrorCode) {
    UNewDataMemory *pData;
    uint16_t headerSize, commentLength;
    char filename[512];
    uint8_t bytes[16];
    int32_t length;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    } else if(name==NULL || *name==0 || pInfo==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    /* allocate the data structure */
    pData=(UNewDataMemory *)uprv_malloc(sizeof(UNewDataMemory));
    if(pData==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    
    /* Check that the full path won't be too long */
    length = 0;					/* Start with nothing */
    if(dir != NULL  && *dir !=0)	/* Add directory length if one was given */
    {
    	length += static_cast<int32_t>(strlen(dir));
	
    	/* Add 1 if dir doesn't end with path sep */
        if (dir[strlen(dir) - 1]!= U_FILE_SEP_CHAR) {
            length++;
        }
	}
    length += static_cast<int32_t>(strlen(name));		/* Add the filename length */

    if(type != NULL  && *type !=0) { /* Add directory length if  given */
        length += static_cast<int32_t>(strlen(type));
    }

        
     /* LDH buffer Length error check */
    if(length  > ((int32_t)sizeof(filename) - 1))
    {
   	    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
   	    uprv_free(pData);
	    return NULL;
    }
   
    /* open the output file */
    if(dir!=NULL && *dir!=0) { /* if dir has a value, we prepend it to the filename */
        char *p=filename+strlen(dir);
        uprv_strcpy(filename, dir);
        if (*(p-1)!=U_FILE_SEP_CHAR) {
            *p++=U_FILE_SEP_CHAR;
            *p=0;
        }
    } else { /* otherwise, we'll output to the current dir */
        filename[0]=0;
    }
    uprv_strcat(filename, name);
    if(type!=NULL && *type!=0) {
        uprv_strcat(filename, ".");
        uprv_strcat(filename, type);
    }
    pData->file=T_FileStream_open(filename, "wb");
    if(pData->file==NULL) {
        uprv_free(pData);
        *pErrorCode=U_FILE_ACCESS_ERROR;
        return NULL;
    }

    /* write the header information */
    headerSize=(uint16_t)(pInfo->size+4);
    if(comment!=NULL && *comment!=0) {
        commentLength=(uint16_t)(uprv_strlen(comment)+1);
        headerSize+=commentLength;
    } else {
        commentLength=0;
    }

    /* write the size of the header, take padding into account */
    pData->headerSize=(uint16_t)((headerSize+15)&~0xf);
    pData->magic1=0xda;
    pData->magic2=0x27;
    T_FileStream_write(pData->file, &pData->headerSize, 4);

    /* write the information data */
    T_FileStream_write(pData->file, pInfo, pInfo->size);

    /* write the comment */
    if(commentLength>0) {
        T_FileStream_write(pData->file, comment, commentLength);
    }

    /* write padding bytes to align the data section to 16 bytes */
    headerSize&=0xf;
    if(headerSize!=0) {
        headerSize=(uint16_t)(16-headerSize);
        uprv_memset(bytes, 0, headerSize);
        T_FileStream_write(pData->file, bytes, headerSize);
    }

    return pData;
}